

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
MemberReserve(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *this,SizeType newCapacity,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  uint uVar1;
  void *pvVar2;
  
  if ((this->data_).f.flags == 3) {
    uVar1 = (this->data_).s.hashcode;
    if (uVar1 < newCapacity) {
      pvVar2 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                         (allocator,(void *)((ulong)(this->data_).s.str & 0xffffffffffff),
                          (ulong)uVar1 << 5,(ulong)newCapacity << 5);
      (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)pvVar2);
      (this->data_).s.hashcode = newCapacity;
    }
    return this;
  }
  __assert_fail("IsObject()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x4ea,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::MemberReserve(SizeType, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }